

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_SessionFoundHelper::
~initiatorFixtureLookUpSession_SessionFoundHelper
          (initiatorFixtureLookUpSession_SessionFoundHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_SessionFound)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "9=100" + delimSOH
      + "35=A" + delimSOH
      + "49=TW" + delimSOH
      + "56=ISLD" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr != actualSession);
}